

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_jpeg_test_file(FILE *f)

{
  long lVar1;
  undefined1 local_3728 [8];
  jpeg j;
  int r;
  int n;
  FILE *f_local;
  
  lVar1 = ftell((FILE *)f);
  j._14092_4_ = SUB84(lVar1,0);
  start_file((stbi *)local_3728,f);
  j.todo = decode_jpeg_header((jpeg *)local_3728,1);
  fseek((FILE *)f,(long)(int)j._14092_4_,0);
  return j.todo;
}

Assistant:

int stbi_jpeg_test_file(FILE *f)
{
   int n,r;
   jpeg j;
   n = ftell(f);
   start_file(&j.s, f);
   r = decode_jpeg_header(&j, SCAN_type);
   fseek(f,n,SEEK_SET);
   return r;
}